

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ucum.cpp
# Opt level: O0

void __thiscall UCUM_TestRoundTrip2_Test::TestBody(UCUM_TestRoundTrip2_Test *this)

{
  bool bVar1;
  istream *piVar2;
  precise_unit *un;
  ostream *poVar3;
  char *pcVar4;
  uint64_t match_flags;
  char cVar5;
  precise_unit pVar6;
  AssertHelper local_370;
  Message local_368;
  int local_35c;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_1;
  Message local_340;
  int local_334;
  undefined1 local_330 [8];
  AssertionResult gtest_ar;
  undefined1 local_300 [8];
  precise_unit uact;
  string genstring;
  undefined1 local_2b0 [8];
  precise_unit csact;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ustring;
  size_type fc2;
  size_type fc;
  int local_240;
  int local_23c;
  int ceqFail;
  int ciFail;
  string line;
  ifstream i;
  UCUM_TestRoundTrip2_Test *this_local;
  
  std::ifstream::ifstream
            ((undefined1 *)((long)&line.field_2 + 8),
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/example_ucum_codes.csv"
             ,8);
  std::__cxx11::string::string((string *)&ceqFail);
  local_23c = 0;
  local_240 = 0;
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(line.field_2._M_local_buf + 8),(string *)&ceqFail);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    cVar5 = (char)&ceqFail;
    std::__cxx11::string::find_first_of(cVar5,0x2c);
    std::__cxx11::string::find_first_of(cVar5,0x2c);
    std::__cxx11::string::substr((ulong)((long)&name.field_2 + 8),(ulong)&ceqFail);
    match_flags = 0xffffffffffffffff;
    std::__cxx11::string::substr((ulong)&csact.base_units_,(ulong)&ceqFail);
    std::__cxx11::string::string
              ((string *)(genstring.field_2._M_local_buf + 8),
               (string *)(name.field_2._M_local_buf + 8));
    pVar6 = units::unit_from_string((string *)((long)&genstring.field_2 + 8),7);
    csact.multiplier_ = pVar6._8_8_;
    local_2b0 = (undefined1  [8])pVar6.multiplier_;
    std::__cxx11::string::~string((string *)(genstring.field_2._M_local_buf + 8));
    un = (precise_unit *)units::getDefaultFlags();
    units::to_string_abi_cxx11_((string *)&uact.base_units_,(units *)local_2b0,un,match_flags);
    std::__cxx11::string::string((string *)&gtest_ar.message_,(string *)&uact.base_units_);
    pVar6 = units::unit_from_string((string *)&gtest_ar.message_,7);
    uact.multiplier_ = pVar6._8_8_;
    local_300 = (undefined1  [8])pVar6.multiplier_;
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    bVar1 = units::is_error((precise_unit *)local_300);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)(name.field_2._M_local_buf + 8));
      poVar3 = std::operator<<(poVar3,"->");
      poVar3 = std::operator<<(poVar3,(string *)&uact.base_units_);
      poVar3 = std::operator<<(poVar3," does not result in a valid ustring unit for ");
      poVar3 = std::operator<<(poVar3,(string *)&csact.base_units_);
      std::operator<<(poVar3,'\n');
      local_23c = local_23c + 1;
    }
    bVar1 = units::precise_unit::operator!=((precise_unit *)local_300,(precise_unit *)local_2b0);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,(string *)&uact.base_units_);
      poVar3 = std::operator<<(poVar3," and ");
      poVar3 = std::operator<<(poVar3,(string *)(name.field_2._M_local_buf + 8));
      poVar3 = std::operator<<(poVar3," do not produce the same unit ");
      poVar3 = std::operator<<(poVar3,(string *)&csact.base_units_);
      std::operator<<(poVar3,'\n');
      local_240 = local_240 + 1;
    }
    std::__cxx11::string::~string((string *)&uact.base_units_);
    std::__cxx11::string::~string((string *)&csact.base_units_);
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  }
  if (0 < local_240) {
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,local_240);
    std::operator<<(poVar3,"test unit name mismatches between unit and description\n");
  }
  local_334 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_330,"ceqFail","0",&local_240,&local_334);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_ucum.cpp",
               0x243,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  local_35c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_358,"ciFail","0",&local_23c,&local_35c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar1) {
    testing::Message::Message(&local_368);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_ucum.cpp",
               0x244,pcVar4);
    testing::internal::AssertHelper::operator=(&local_370,&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  std::__cxx11::string::~string((string *)&ceqFail);
  std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
  return;
}

Assistant:

TEST(UCUM, TestRoundTrip2)
{
    std::ifstream i(TEST_FILE_FOLDER "/example_ucum_codes.csv");
    std::string line;
    int ciFail = 0;
    int ceqFail = 0;
    while (std::getline(i, line)) {
        auto fc = line.find_first_of(',');
        auto fc2 = line.find_first_of(',', fc + 1);
        auto ustring = line.substr(fc + 1, fc2 - fc - 1);
        auto name = line.substr(fc2 + 1);
        auto csact = units::unit_from_string(ustring, units::strict_ucum);
        std::string genstring = to_string(csact);
        auto uact = units::unit_from_string(genstring, units::strict_ucum);

        if (is_error(uact)) {
            std::cout << ustring << "->" << genstring
                      << " does not result in a valid ustring unit for " << name
                      << '\n';

            ++ciFail;
            // units::unit_from_string(ustring);
            // to_string(csact);
        }

        if (uact != csact) {
            std::cout << genstring << " and " << ustring
                      << " do not produce the same unit " << name << '\n';
            ++ceqFail;
        }
    }
    if (ceqFail > 0) {
        std::cout << ceqFail
                  << "test unit name mismatches between unit and description\n";
    }
    EXPECT_EQ(ceqFail, 0);
    EXPECT_EQ(ciFail, 0);
}